

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_buf.c
# Opt level: O0

void tnt_buf_free(tnt_stream *s)

{
  long *plVar1;
  tnt_stream_buf *sb;
  tnt_stream *s_local;
  
  plVar1 = (long *)s->data;
  if (((int)plVar1[7] == 0) && (*plVar1 != 0)) {
    tnt_mem_free((void *)*plVar1);
  }
  if (plVar1[5] != 0) {
    (*(code *)plVar1[5])(s);
  }
  tnt_mem_free(s->data);
  s->data = (void *)0x0;
  return;
}

Assistant:

static void tnt_buf_free(struct tnt_stream *s) {
	struct tnt_stream_buf *sb = TNT_SBUF_CAST(s);
	if (!sb->as && sb->data)
		tnt_mem_free(sb->data);
	if (sb->free)
		sb->free(s);
	tnt_mem_free(s->data);
	s->data = NULL;
}